

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O0

void duckdb::
     HistogramFinalizeFunction<duckdb::HistogramFunctor,double,duckdb::DefaultMapType<std::unordered_map<double,unsigned_long,std::hash<double>,std::equal_to<double>,std::allocator<std::pair<double_const,unsigned_long>>>>>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  TemplatedValidityMask<unsigned_long> *pTVar1;
  bool bVar2;
  idx_t iVar3;
  size_type sVar4;
  list_entry_t *value;
  Vector *result_00;
  reference ppVar5;
  UnifiedVectorFormat *in_RCX;
  Vector *in_RDX;
  ulong in_RDI;
  long in_R8;
  pair<const_double,_unsigned_long> *entry;
  iterator __end0;
  iterator __begin0;
  unordered_map<double,_unsigned_long,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
  *__range3;
  list_entry_t *list_entry;
  HistogramAggState<double,_std::unordered_map<double,_unsigned_long,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>_>
  *state_1;
  idx_t rid;
  idx_t i_1;
  idx_t current_offset;
  unsigned_long *count_entries;
  list_entry_t *list_entries;
  Vector *values;
  Vector *keys;
  HistogramAggState<double,_std::unordered_map<double,_unsigned_long,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>_>
  *state;
  idx_t i;
  idx_t new_entries;
  idx_t old_len;
  ValidityMask *mask;
  HistogramAggState<double,_std::unordered_map<double,_unsigned_long,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>_>
  **states;
  UnifiedVectorFormat sdata;
  unordered_map<double,_unsigned_long,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
  *in_stack_fffffffffffffe98;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffea0;
  _Node_iterator_base<std::pair<const_double,_unsigned_long>,_false> local_110;
  _Node_iterator_base<std::pair<const_double,_unsigned_long>,_false> local_108;
  unsigned_long local_100;
  list_entry_t *local_f8;
  unsigned_long *local_f0;
  UnifiedVectorFormat *local_e8;
  UnifiedVectorFormat *local_e0;
  ulong local_d8;
  Vector *local_d0;
  list_entry_t *local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  HistogramAggState<double,_std::unordered_map<double,_unsigned_long,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>_>
  *local_b0;
  UnifiedVectorFormat *local_a8;
  long local_a0;
  ulong local_98;
  ValidityMask *local_90;
  TemplatedValidityMask<unsigned_long> *local_88;
  SelectionVector *local_70 [9];
  long local_28;
  UnifiedVectorFormat *local_20;
  Vector *local_18;
  ulong local_8;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_70);
  duckdb::Vector::ToUnifiedFormat(local_8,local_20);
  local_88 = (TemplatedValidityMask<unsigned_long> *)
             UnifiedVectorFormat::
             GetData<duckdb::HistogramAggState<double,std::unordered_map<double,unsigned_long,std::hash<double>,std::equal_to<double>,std::allocator<std::pair<double_const,unsigned_long>>>>*>
                       ((UnifiedVectorFormat *)local_70);
  local_90 = FlatVector::Validity((Vector *)0xb6278f);
  local_98 = duckdb::ListVector::GetListSize(local_18);
  local_a0 = 0;
  for (local_a8 = (UnifiedVectorFormat *)0x0; pTVar1 = local_88, local_a8 < local_20;
      local_a8 = local_a8 + 1) {
    iVar3 = SelectionVector::get_index(local_70[0],(idx_t)local_a8);
    local_b0 = (HistogramAggState<double,_std::unordered_map<double,_unsigned_long,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>_>
                *)(&pTVar1->validity_mask)[iVar3];
    if (local_b0->hist !=
        (unordered_map<double,_unsigned_long,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
         *)0x0) {
      sVar4 = std::
              unordered_map<double,_unsigned_long,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
              ::size((unordered_map<double,_unsigned_long,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
                      *)0xb6286e);
      local_a0 = sVar4 + local_a0;
    }
  }
  duckdb::ListVector::Reserve(local_18,local_98 + local_a0);
  local_b8 = duckdb::MapVector::GetKeys(local_18);
  local_c0 = duckdb::MapVector::GetValues(local_18);
  value = FlatVector::GetData<duckdb::list_entry_t>((Vector *)0xb62908);
  local_c8 = value;
  result_00 = (Vector *)FlatVector::GetData<unsigned_long>((Vector *)0xb62929);
  local_d8 = local_98;
  local_d0 = result_00;
  for (local_e0 = (UnifiedVectorFormat *)0x0; local_e0 < local_20; local_e0 = local_e0 + 1) {
    local_e8 = local_e0 + local_28;
    in_stack_fffffffffffffea0 = local_88;
    iVar3 = SelectionVector::get_index(local_70[0],(idx_t)local_e0);
    local_f0 = (&in_stack_fffffffffffffea0->validity_mask)[iVar3];
    if (*local_f0 == 0) {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (in_stack_fffffffffffffea0,(idx_t)in_stack_fffffffffffffe98);
    }
    else {
      local_f8 = local_c8 + (long)local_e8;
      local_f8->offset = local_d8;
      local_100 = *local_f0;
      local_108._M_cur =
           (__node_type *)
           std::
           unordered_map<double,_unsigned_long,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
           ::begin(in_stack_fffffffffffffe98);
      local_110._M_cur =
           (__node_type *)
           std::
           unordered_map<double,_unsigned_long,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
           ::end(in_stack_fffffffffffffe98);
      while (bVar2 = std::__detail::operator!=(&local_108,&local_110), bVar2) {
        ppVar5 = std::__detail::_Node_iterator<std::pair<const_double,_unsigned_long>,_false,_false>
                 ::operator*((_Node_iterator<std::pair<const_double,_unsigned_long>,_false,_false> *
                             )0xb62a57);
        HistogramFunctor::HistogramFinalize<double>
                  ((double)value,result_00,(idx_t)in_stack_fffffffffffffea0);
        *(unsigned_long *)(local_d0 + local_d8 * 8) = ppVar5->second;
        local_d8 = local_d8 + 1;
        std::__detail::_Node_iterator<std::pair<const_double,_unsigned_long>,_false,_false>::
        operator++((_Node_iterator<std::pair<const_double,_unsigned_long>,_false,_false> *)
                   in_stack_fffffffffffffea0);
      }
      local_f8->length = local_d8 - local_f8->offset;
    }
  }
  duckdb::ListVector::SetListSize(local_18,local_d8);
  duckdb::Vector::Verify((ulong)local_18);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffea0);
  return;
}

Assistant:

static void HistogramFinalizeFunction(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count,
                                      idx_t offset) {
	using HIST_STATE = HistogramAggState<T, typename MAP_TYPE::MAP_TYPE>;

	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);
	auto states = UnifiedVectorFormat::GetData<HIST_STATE *>(sdata);

	auto &mask = FlatVector::Validity(result);
	auto old_len = ListVector::GetListSize(result);
	idx_t new_entries = 0;
	// figure out how much space we need
	for (idx_t i = 0; i < count; i++) {
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.hist) {
			continue;
		}
		new_entries += state.hist->size();
	}
	// reserve space in the list vector
	ListVector::Reserve(result, old_len + new_entries);
	auto &keys = MapVector::GetKeys(result);
	auto &values = MapVector::GetValues(result);
	auto list_entries = FlatVector::GetData<list_entry_t>(result);
	auto count_entries = FlatVector::GetData<uint64_t>(values);

	idx_t current_offset = old_len;
	for (idx_t i = 0; i < count; i++) {
		const auto rid = i + offset;
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.hist) {
			mask.SetInvalid(rid);
			continue;
		}

		auto &list_entry = list_entries[rid];
		list_entry.offset = current_offset;
		for (auto &entry : *state.hist) {
			OP::template HistogramFinalize<T>(entry.first, keys, current_offset);
			count_entries[current_offset] = entry.second;
			current_offset++;
		}
		list_entry.length = current_offset - list_entry.offset;
	}
	D_ASSERT(current_offset == old_len + new_entries);
	ListVector::SetListSize(result, current_offset);
	result.Verify(count);
}